

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_tpl.h
# Opt level: O3

uint32_t longest_match_slow_sse2(deflate_state *s,Pos cur_match)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  Pos *pPVar7;
  long lVar8;
  ushort uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint32_t uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uchar *puVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  uchar *puVar25;
  ulong uVar26;
  ulong uVar27;
  ushort uVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int align_offset;
  ulong local_b8;
  ulong local_90;
  ulong local_50;
  int local_48;
  
  uVar22 = (ulong)cur_match;
  uVar4 = s->strstart;
  uVar26 = (ulong)uVar4;
  uVar5 = s->w_mask;
  puVar6 = s->window;
  uVar19 = 2;
  if (s->prev_length != 0) {
    uVar19 = s->prev_length;
  }
  uVar24 = 0xffffffff;
  if (3 < uVar19) {
    uVar24 = (uint)(uVar19 < 8) << 2 | 0xfffffff9;
  }
  local_90 = *(ulong *)(puVar6 + (uVar24 + uVar19) + uVar26);
  puVar25 = puVar6 + (uVar24 + uVar19);
  uVar24 = s->lookahead;
  uVar32 = s->max_chain_length >> 2;
  if (uVar19 < s->good_match) {
    uVar32 = s->max_chain_length;
  }
  uVar12 = s->w_size - 0x106;
  uVar27 = 0;
  uVar20 = uVar4 - uVar12;
  if (uVar4 < uVar12 || uVar20 == 0) {
    uVar20 = 0;
  }
  pPVar7 = s->prev;
  lVar8 = *(long *)(puVar6 + uVar26);
  uVar12 = s->nice_match;
  puVar17 = puVar6;
  uVar29 = uVar20;
  if (2 < uVar19) {
    uVar27 = 0;
    uVar13 = (*s->update_hash)(0,(uint)((ulong)lVar8 >> 8) & 0xff);
    uVar13 = (*s->update_hash)(uVar13,(uint32_t)puVar6[uVar26 + 2]);
    uVar30 = 3;
    do {
      uVar13 = (*s->update_hash)(uVar13,(uint32_t)puVar6[uVar30 + uVar26]);
      if (s->head[uVar13] < (ushort)uVar22) {
        uVar27 = (ulong)((int)uVar30 - 2);
        uVar22 = (ulong)s->head[uVar13];
      }
      uVar29 = (int)uVar30 + 1;
      uVar30 = (ulong)uVar29;
    } while (uVar29 <= uVar19);
    uVar29 = (int)uVar27 + uVar20;
    if ((ushort)uVar22 <= (ushort)uVar29) {
LAB_0010f55f:
      if (s->lookahead <= uVar19) {
        return s->lookahead;
      }
      return uVar19;
    }
    puVar25 = puVar25 + -(uVar27 & 0xffff);
    puVar17 = puVar6 + -(uVar27 & 0xffff);
  }
  if (uVar4 <= (uint)uVar22) {
    return uVar19;
  }
  local_b8 = local_90 >> 0x10 & 0xffff;
  local_50 = local_90 >> 0x20;
  puVar1 = puVar6 + uVar26 + 2;
  uVar18 = (uint)puVar1 & 0xf;
  uVar14 = (ulong)(0x10 - uVar18);
  local_48 = 0x10 - uVar18;
  uVar30 = (ulong)uVar19;
LAB_0010f194:
  uVar18 = (uint)uVar30;
  uVar28 = (ushort)uVar29;
  if (uVar18 < 4) {
    while( true ) {
      uVar31 = (uint)uVar22;
      uVar15 = uVar22 & 0xffff;
      if ((*(ushort *)(puVar25 + uVar15) == (ushort)local_90) &&
         (*(short *)(puVar17 + uVar15) == (short)lVar8)) break;
      if (uVar32 == 1) {
        return uVar18;
      }
      uVar22 = (ulong)pPVar7[(uint)uVar15 & uVar5];
      uVar32 = uVar32 - 1;
      if (pPVar7[(uint)uVar15 & uVar5] <= uVar28) {
        return uVar18;
      }
    }
  }
  else if (uVar18 < 8) {
    while( true ) {
      uVar31 = (uint)uVar22;
      uVar15 = uVar22 & 0xffff;
      if ((*(uint *)(puVar25 + uVar15) == ((int)local_b8 << 0x10 | (uint)(ushort)local_90)) &&
         (*(int *)(puVar17 + uVar15) == (int)lVar8)) break;
      if (uVar32 == 1) {
        return uVar18;
      }
      uVar22 = (ulong)pPVar7[(uint)uVar15 & uVar5];
      uVar32 = uVar32 - 1;
      if (pPVar7[(uint)uVar15 & uVar5] <= uVar28) {
        return uVar18;
      }
    }
  }
  else {
    while( true ) {
      uVar31 = (uint)uVar22;
      uVar15 = uVar22 & 0xffff;
      if ((*(ulong *)(puVar25 + uVar15) ==
           (local_50 << 0x20 | local_90 & 0xffff | (ulong)(uint)((int)local_b8 << 0x10))) &&
         (*(long *)(puVar17 + uVar15) == lVar8)) break;
      if (uVar32 == 1) {
        return uVar18;
      }
      uVar22 = (ulong)pPVar7[(uint)uVar15 & uVar5];
      uVar32 = uVar32 - 1;
      if (pPVar7[(uint)uVar15 & uVar5] <= uVar28) {
        return uVar18;
      }
    }
  }
  puVar3 = puVar17 + uVar15 + 2;
  auVar34[0] = -(*puVar3 == *puVar1);
  auVar34[1] = -(puVar3[1] == puVar6[uVar26 + 3]);
  auVar34[2] = -(puVar3[2] == puVar6[uVar26 + 4]);
  auVar34[3] = -(puVar3[3] == puVar6[uVar26 + 5]);
  auVar34[4] = -(puVar3[4] == puVar6[uVar26 + 6]);
  auVar34[5] = -(puVar3[5] == puVar6[uVar26 + 7]);
  auVar34[6] = -(puVar3[6] == puVar6[uVar26 + 8]);
  auVar34[7] = -(puVar3[7] == puVar6[uVar26 + 9]);
  auVar34[8] = -(puVar3[8] == puVar6[uVar26 + 10]);
  auVar34[9] = -(puVar3[9] == puVar6[uVar26 + 0xb]);
  auVar34[10] = -(puVar3[10] == puVar6[uVar26 + 0xc]);
  auVar34[0xb] = -(puVar3[0xb] == puVar6[uVar26 + 0xd]);
  auVar34[0xc] = -(puVar3[0xc] == puVar6[uVar26 + 0xe]);
  auVar34[0xd] = -(puVar3[0xd] == puVar6[uVar26 + 0xf]);
  auVar34[0xe] = -(puVar3[0xe] == puVar6[uVar26 + 0x10]);
  auVar34[0xf] = -(puVar3[0xf] == puVar6[uVar26 + 0x11]);
  uVar9 = (ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe | (ushort)(auVar34[0xf] >> 7) << 0xf;
  if (uVar9 == 0xffff) {
    lVar23 = 0;
LAB_0010f2db:
    puVar3 = puVar17 + lVar23 + uVar14 + uVar15 + 2;
    puVar2 = puVar6 + lVar23 + uVar14 + uVar26 + 2;
    auVar33[0] = -(*puVar3 == *puVar2);
    auVar33[1] = -(puVar3[1] == puVar2[1]);
    auVar33[2] = -(puVar3[2] == puVar2[2]);
    auVar33[3] = -(puVar3[3] == puVar2[3]);
    auVar33[4] = -(puVar3[4] == puVar2[4]);
    auVar33[5] = -(puVar3[5] == puVar2[5]);
    auVar33[6] = -(puVar3[6] == puVar2[6]);
    auVar33[7] = -(puVar3[7] == puVar2[7]);
    auVar33[8] = -(puVar3[8] == puVar2[8]);
    auVar33[9] = -(puVar3[9] == puVar2[9]);
    auVar33[10] = -(puVar3[10] == puVar2[10]);
    auVar33[0xb] = -(puVar3[0xb] == puVar2[0xb]);
    auVar33[0xc] = -(puVar3[0xc] == puVar2[0xc]);
    auVar33[0xd] = -(puVar3[0xd] == puVar2[0xd]);
    auVar33[0xe] = -(puVar3[0xe] == puVar2[0xe]);
    auVar33[0xf] = -(puVar3[0xf] == puVar2[0xf]);
    uVar9 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf;
    if (uVar9 == 0xffff) goto code_r0x0010f2f2;
    uVar19 = ~(uint)uVar9;
    iVar21 = 0;
    if (uVar19 != 0) {
      for (; (uVar19 >> iVar21 & 1) == 0; iVar21 = iVar21 + 1) {
      }
    }
    iVar21 = (int)lVar23 + local_48 + iVar21;
    goto LAB_0010f374;
  }
  uVar19 = ~(uint)uVar9;
  iVar21 = 0;
  if (uVar19 != 0) {
    for (; (uVar19 >> iVar21 & 1) == 0; iVar21 = iVar21 + 1) {
    }
  }
  goto LAB_0010f374;
code_r0x0010f2f2:
  lVar23 = lVar23 + 0x10;
  if ((int)lVar23 == 0xf0) goto code_r0x0010f2fe;
  goto LAB_0010f2db;
code_r0x0010f2fe:
  if (((ulong)puVar1 & 0xf) == 0) {
    iVar21 = 0x100;
  }
  else {
    auVar35[0] = -(puVar17[uVar15 + 0xf2] == puVar6[uVar26 + 0xf2]);
    auVar35[1] = -(puVar17[uVar15 + 0xf3] == puVar6[uVar26 + 0xf3]);
    auVar35[2] = -(puVar17[uVar15 + 0xf4] == puVar6[uVar26 + 0xf4]);
    auVar35[3] = -(puVar17[uVar15 + 0xf5] == puVar6[uVar26 + 0xf5]);
    auVar35[4] = -(puVar17[uVar15 + 0xf6] == puVar6[uVar26 + 0xf6]);
    auVar35[5] = -(puVar17[uVar15 + 0xf7] == puVar6[uVar26 + 0xf7]);
    auVar35[6] = -(puVar17[uVar15 + 0xf8] == puVar6[uVar26 + 0xf8]);
    auVar35[7] = -(puVar17[uVar15 + 0xf9] == puVar6[uVar26 + 0xf9]);
    auVar35[8] = -(puVar17[uVar15 + 0xfa] == puVar6[uVar26 + 0xfa]);
    auVar35[9] = -(puVar17[uVar15 + 0xfb] == puVar6[uVar26 + 0xfb]);
    auVar35[10] = -(puVar17[uVar15 + 0xfc] == puVar6[uVar26 + 0xfc]);
    auVar35[0xb] = -(puVar17[uVar15 + 0xfd] == puVar6[uVar26 + 0xfd]);
    auVar35[0xc] = -(puVar17[uVar15 + 0xfe] == puVar6[uVar26 + 0xfe]);
    auVar35[0xd] = -(puVar17[uVar15 + 0xff] == puVar6[uVar26 + 0xff]);
    auVar35[0xe] = -(puVar17[uVar15 + 0x100] == puVar6[uVar26 + 0x100]);
    auVar35[0xf] = -(puVar17[uVar15 + 0x101] == puVar6[uVar26 + 0x101]);
    uVar9 = (ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe | (ushort)(auVar35[0xf] >> 7) << 0xf;
    iVar21 = 0x100;
    if (uVar9 != 0xffff) {
      uVar19 = ~(uint)uVar9;
      iVar21 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> iVar21 & 1) == 0; iVar21 = iVar21 + 1) {
        }
      }
      iVar21 = iVar21 + 0xf0;
    }
  }
LAB_0010f374:
  uVar19 = iVar21 + 2;
  uVar15 = (ulong)uVar19;
  if (uVar18 < uVar19) {
    uVar18 = (uVar31 & 0xffff) - ((uint)uVar27 & 0xffff);
    uVar22 = (ulong)uVar18;
    s->match_start = uVar18;
    if (uVar24 < uVar19) {
      return uVar24;
    }
    if (uVar12 <= uVar19) {
      return uVar19;
    }
    uVar10 = iVar21 - 5;
    if (uVar19 < 8) {
      uVar10 = iVar21 - 1U;
    }
    if (uVar19 < 4) {
      uVar10 = iVar21 + 1;
    }
    uVar30 = (ulong)uVar10;
    local_90 = *(ulong *)(puVar6 + uVar30 + uVar26);
    local_b8 = local_90 >> 0x10 & 0xffff;
    local_50 = local_90 >> 0x20;
    if ((3 < uVar19) && (uVar19 + uVar18 < uVar4)) {
      uVar16 = 0;
      uVar27 = 0;
      do {
        iVar11 = (int)uVar16;
        uVar28 = pPVar7[(uVar18 & 0xffff) + iVar11 & uVar5];
        if (uVar28 < (ushort)uVar22) {
          if ((uint)uVar28 <= (uVar20 & 0xffff) + iVar11) goto LAB_0010f55f;
          uVar22 = (ulong)uVar28;
          uVar27 = uVar16;
        }
        uVar16 = (ulong)(iVar11 + 1U);
      } while (iVar11 + 1U <= iVar21 - 1U);
      uVar13 = (*s->update_hash)(0,(uint32_t)puVar6[uVar15 + (uVar26 - 4)]);
      uVar13 = (*s->update_hash)(uVar13,(uint32_t)puVar6[uVar15 + (uVar26 - 3)]);
      uVar13 = (*s->update_hash)(uVar13,(uint32_t)puVar6[uVar15 + (uVar26 - 2)]);
      uVar28 = s->head[uVar13];
      if (uVar28 < (ushort)uVar22) {
        uVar27 = (ulong)(iVar21 - 2U);
        uVar22 = (ulong)uVar28;
        if ((uint)uVar28 <= (iVar21 - 2U & 0xffff) + (uVar20 & 0xffff)) goto LAB_0010f55f;
      }
      uVar29 = (int)uVar27 + uVar20;
      puVar17 = puVar6 + -(uVar27 & 0xffff);
      puVar25 = puVar17 + uVar30;
      goto LAB_0010f43f;
    }
    puVar25 = puVar17 + uVar30;
    uVar30 = uVar15;
  }
  uVar15 = uVar30;
  uVar32 = uVar32 - 1;
  if (uVar32 == 0) {
    return (uint32_t)uVar15;
  }
  uVar22 = (ulong)pPVar7[uVar31 & 0xffff & uVar5];
  if (pPVar7[uVar31 & 0xffff & uVar5] <= uVar28) {
    return (uint32_t)uVar15;
  }
LAB_0010f43f:
  uVar30 = uVar15;
  if (uVar4 <= ((uint)uVar22 & 0xffff)) {
    return (uint32_t)uVar15;
  }
  goto LAB_0010f194;
}

Assistant:

Z_INTERNAL uint32_t LONGEST_MATCH(deflate_state *const s, Pos cur_match) {
    unsigned int strstart = s->strstart;
    const unsigned wmask = s->w_mask;
    unsigned char *window = s->window;
    unsigned char *scan = window + strstart;
    Z_REGISTER unsigned char *mbase_start = window;
    Z_REGISTER unsigned char *mbase_end;
    const Pos *prev = s->prev;
    Pos limit;
#ifdef LONGEST_MATCH_SLOW
    Pos limit_base;
#else
    int32_t early_exit;
#endif
    uint32_t chain_length, nice_match, best_len, offset;
    uint32_t lookahead = s->lookahead;
    Pos match_offset = 0;
    uint64_t scan_start;
    uint64_t scan_end;

#define GOTO_NEXT_CHAIN \
    if (--chain_length && (cur_match = prev[cur_match & wmask]) > limit) \
        continue; \
    return best_len;

    /* The code is optimized for STD_MAX_MATCH-2 multiple of 16. */
    Assert(STD_MAX_MATCH == 258, "Code too clever");

    best_len = s->prev_length ? s->prev_length : STD_MIN_MATCH-1;

    /* Calculate read offset which should only extend an extra byte
     * to find the next best match length.
     */
    offset = best_len-1;
    if (best_len >= sizeof(uint32_t)) {
        offset -= 2;
        if (best_len >= sizeof(uint64_t))
            offset -= 4;
    }

    scan_start = zng_memread_8(scan);
    scan_end = zng_memread_8(scan+offset);
    mbase_end  = (mbase_start+offset);

    /* Do not waste too much time if we already have a good match */
    chain_length = s->max_chain_length;
    if (best_len >= s->good_match)
        chain_length >>= 2;
    nice_match = (uint32_t)s->nice_match;

    /* Stop when cur_match becomes <= limit. To simplify the code,
     * we prevent matches with the string of window index 0
     */
    limit = strstart > MAX_DIST(s) ? (Pos)(strstart - MAX_DIST(s)) : 0;
#ifdef LONGEST_MATCH_SLOW
    limit_base = limit;
    if (best_len >= STD_MIN_MATCH) {
        /* We're continuing search (lazy evaluation). */
        uint32_t i, hash;
        Pos pos;

        /* Find a most distant chain starting from scan with index=1 (index=0 corresponds
         * to cur_match). We cannot use s->prev[strstart+1,...] immediately, because
         * these strings are not yet inserted into the hash table.
         */
        hash = s->update_hash(0, scan[1]);
        hash = s->update_hash(hash, scan[2]);

        for (i = 3; i <= best_len; i++) {
            hash = s->update_hash(hash, scan[i]);

            /* If we're starting with best_len >= 3, we can use offset search. */
            pos = s->head[hash];
            if (pos < cur_match) {
                match_offset = (Pos)(i - 2);
                cur_match = pos;
            }
        }

        /* Update offset-dependent variables */
        limit = limit_base+match_offset;
        if (cur_match <= limit)
            goto break_matching;
        mbase_start -= match_offset;
        mbase_end -= match_offset;
    }
#else
    early_exit = s->level < EARLY_EXIT_TRIGGER_LEVEL;
#endif
    Assert((unsigned long)strstart <= s->window_size - MIN_LOOKAHEAD, "need lookahead");
    for (;;) {
        if (cur_match >= strstart)
            break;

        /* Skip to next match if the match length cannot increase or if the match length is
         * less than 2. Note that the checks below for insufficient lookahead only occur
         * occasionally for performance reasons.
         * Therefore uninitialized memory will be accessed and conditional jumps will be made
         * that depend on those values. However the length of the match is limited to the
         * lookahead, so the output of deflate is not affected by the uninitialized values.
         */
        if (best_len < sizeof(uint32_t)) {
            for (;;) {
                if (zng_memcmp_2(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_2(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else if (best_len >= sizeof(uint64_t)) {
            for (;;) {
                if (zng_memcmp_8(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_8(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else {
            for (;;) {
                if (zng_memcmp_4(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_4(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        }
        uint32_t len = COMPARE256(scan+2, mbase_start+cur_match+2) + 2;
        Assert(scan+len <= window+(unsigned)(s->window_size-1), "wild scan");

        if (len > best_len) {
            uint32_t match_start = cur_match - match_offset;
            s->match_start = match_start;

            /* Do not look for matches beyond the end of the input. */
            if (len > lookahead)
                return lookahead;
            best_len = len;
            if (best_len >= nice_match)
                return best_len;

            offset = best_len-1;
            if (best_len >= sizeof(uint32_t)) {
                offset -= 2;
                if (best_len >= sizeof(uint64_t))
                    offset -= 4;
            }

            scan_end = zng_memread_8(scan+offset);

#ifdef LONGEST_MATCH_SLOW
            /* Look for a better string offset */
            if (UNLIKELY(len > STD_MIN_MATCH && match_start + len < strstart)) {
                Pos pos, next_pos;
                uint32_t i, hash;
                unsigned char *scan_endstr;

                /* Go back to offset 0 */
                cur_match -= match_offset;
                match_offset = 0;
                next_pos = cur_match;
                for (i = 0; i <= len - STD_MIN_MATCH; i++) {
                    pos = prev[(cur_match + i) & wmask];
                    if (pos < next_pos) {
                        /* Hash chain is more distant, use it */
                        if (pos <= limit_base + i)
                            goto break_matching;
                        next_pos = pos;
                        match_offset = (Pos)i;
                    }
                }
                /* Switch cur_match to next_pos chain */
                cur_match = next_pos;

                /* Try hash head at len-(STD_MIN_MATCH-1) position to see if we could get
                 * a better cur_match at the end of string. Using (STD_MIN_MATCH-1) lets
                 * us include one more byte into hash - the byte which will be checked
                 * in main loop now, and which allows to grow match by 1.
                 */
                scan_endstr = scan + len - (STD_MIN_MATCH+1);

                hash = s->update_hash(0, scan_endstr[0]);
                hash = s->update_hash(hash, scan_endstr[1]);
                hash = s->update_hash(hash, scan_endstr[2]);

                pos = s->head[hash];
                if (pos < cur_match) {
                    match_offset = (Pos)(len - (STD_MIN_MATCH+1));
                    if (pos <= limit_base + match_offset)
                        goto break_matching;
                    cur_match = pos;
                }

                /* Update offset-dependent variables */
                limit = limit_base+match_offset;
                mbase_start = window-match_offset;
                mbase_end = (mbase_start+offset);
                continue;
            }
#endif
            mbase_end = (mbase_start+offset);
        }
#ifndef LONGEST_MATCH_SLOW
        else if (UNLIKELY(early_exit)) {
            /* The probability of finding a match later if we here is pretty low, so for
             * performance it's best to outright stop here for the lower compression levels
             */
            break;
        }
#endif
        GOTO_NEXT_CHAIN;
    }
    return best_len;

#ifdef LONGEST_MATCH_SLOW
break_matching:

    if (best_len < s->lookahead)
        return best_len;

    return s->lookahead;
#endif
}